

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_limit.cpp
# Opt level: O1

idx_t __thiscall
duckdb::LogicalLimit::EstimateCardinality(LogicalLimit *this,ClientContext *context)

{
  LimitNodeType LVar1;
  int iVar2;
  reference this_00;
  pointer pLVar3;
  undefined4 extraout_var;
  idx_t iVar4;
  ulong uVar5;
  BoundLimitNode *this_01;
  double dVar6;
  undefined1 auVar7 [16];
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(this->super_LogicalOperator).children,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(this_00);
  iVar2 = (*pLVar3->_vptr_LogicalOperator[7])(pLVar3,context);
  uVar5 = CONCAT44(extraout_var,iVar2);
  LVar1 = (this->limit_val).type;
  this_01 = &this->limit_val;
  if (LVar1 == CONSTANT_PERCENTAGE) {
    auVar7._8_4_ = extraout_var;
    auVar7._0_8_ = uVar5;
    auVar7._12_4_ = 0x45300000;
    dVar6 = BoundLimitNode::GetConstantPercentage(this_01);
    dVar6 = dVar6 * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0));
    uVar5 = (ulong)dVar6;
    uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
  }
  else if (LVar1 == CONSTANT_VALUE) {
    iVar4 = BoundLimitNode::GetConstantValue(this_01);
    if (iVar4 < uVar5) {
      iVar4 = BoundLimitNode::GetConstantValue(this_01);
      return iVar4;
    }
  }
  return uVar5;
}

Assistant:

idx_t LogicalLimit::EstimateCardinality(ClientContext &context) {
	auto child_cardinality = children[0]->EstimateCardinality(context);
	switch (limit_val.Type()) {
	case LimitNodeType::CONSTANT_VALUE:
		if (limit_val.GetConstantValue() < child_cardinality) {
			child_cardinality = limit_val.GetConstantValue();
		}
		break;
	case LimitNodeType::CONSTANT_PERCENTAGE:
		child_cardinality = idx_t(double(child_cardinality) * limit_val.GetConstantPercentage());
		break;
	default:
		break;
	}
	return child_cardinality;
}